

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack4.h
# Opt level: O0

void ncnn::conv1x1s1_sgemm_transform_kernel_pack4_sse
               (Mat *kernel,Mat *kernel_pack4,int inch,int outch)

{
  int in_ECX;
  int in_EDX;
  Mat *in_RDI;
  int p;
  float *g0;
  float *k3;
  float *k2;
  float *k1;
  float *k0;
  int q;
  int in_stack_ffffffffffffff44;
  size_t in_stack_ffffffffffffff48;
  Mat *this;
  undefined8 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int iVar1;
  int in_stack_ffffffffffffff64;
  Mat *in_stack_ffffffffffffff68;
  Allocator *in_stack_ffffffffffffff70;
  float *local_48;
  float *local_40;
  float *local_38;
  float *local_30;
  float *local_28;
  int local_1c;
  
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_EDX / 4,
              in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
              in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff70);
  for (local_1c = 0; local_1c + 3 < in_ECX; local_1c = local_1c + 4) {
    local_28 = Mat::operator_cast_to_float_(in_RDI);
    local_28 = local_28 + local_1c * in_EDX;
    local_30 = Mat::operator_cast_to_float_(in_RDI);
    local_30 = local_30 + (local_1c + 1) * in_EDX;
    local_38 = Mat::operator_cast_to_float_(in_RDI);
    local_38 = local_38 + (local_1c + 2) * in_EDX;
    local_40 = Mat::operator_cast_to_float_(in_RDI);
    local_40 = local_40 + (local_1c + 3) * in_EDX;
    this = (Mat *)&stack0xffffffffffffff70;
    Mat::channel(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    local_48 = Mat::operator_cast_to_float_(this);
    Mat::~Mat((Mat *)0x2c7bc9);
    for (iVar1 = 0; iVar1 + 3 < in_EDX; iVar1 = iVar1 + 4) {
      *local_48 = *local_28;
      local_48[1] = *local_30;
      local_48[2] = *local_38;
      local_48[3] = *local_40;
      local_48[4] = local_28[1];
      local_48[5] = local_30[1];
      local_48[6] = local_38[1];
      local_48[7] = local_40[1];
      local_48[8] = local_28[2];
      local_48[9] = local_30[2];
      local_48[10] = local_38[2];
      local_48[0xb] = local_40[2];
      local_48[0xc] = local_28[3];
      local_48[0xd] = local_30[3];
      local_48[0xe] = local_38[3];
      local_48[0xf] = local_40[3];
      local_28 = local_28 + 4;
      local_30 = local_30 + 4;
      local_38 = local_38 + 4;
      local_40 = local_40 + 4;
      local_48 = local_48 + 0x10;
    }
  }
  return;
}

Assistant:

static void conv1x1s1_sgemm_transform_kernel_pack4_sse(const Mat& kernel, Mat& kernel_pack4, int inch, int outch)
{
    // interleave
    // src = inch-outch
    // dst = 4b-4a-inch/4a-outch/4b
    kernel_pack4.create(1, inch / 4, outch / 4, (size_t)4u * 16, 16);

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        const float* k0 = (const float*)kernel + (q + 0) * inch;
        const float* k1 = (const float*)kernel + (q + 1) * inch;
        const float* k2 = (const float*)kernel + (q + 2) * inch;
        const float* k3 = (const float*)kernel + (q + 3) * inch;

        float* g0 = kernel_pack4.channel(q / 4);

        for (int p = 0; p + 3 < inch; p += 4)
        {
            g0[0] = k0[0];
            g0[1] = k1[0];
            g0[2] = k2[0];
            g0[3] = k3[0];

            g0[4] = k0[1];
            g0[5] = k1[1];
            g0[6] = k2[1];
            g0[7] = k3[1];

            g0[8] = k0[2];
            g0[9] = k1[2];
            g0[10] = k2[2];
            g0[11] = k3[2];

            g0[12] = k0[3];
            g0[13] = k1[3];
            g0[14] = k2[3];
            g0[15] = k3[3];

            k0 += 4;
            k1 += 4;
            k2 += 4;
            k3 += 4;
            g0 += 16;
        }
    }
}